

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

bool __thiscall slang::ast::LookupResult::hasError(LookupResult *this)

{
  size_type sVar1;
  bool bVar2;
  Diagnostic *this_00;
  long lVar3;
  bool bVar4;
  
  if ((this->found != (Symbol *)0x0) || (bVar4 = true, ((this->flags).m_bits & 5) == 0)) {
    sVar1 = (this->diagnostics).super_SmallVector<slang::Diagnostic,_2UL>.
            super_SmallVectorBase<slang::Diagnostic>.len;
    bVar4 = sVar1 != 0;
    if (bVar4) {
      this_00 = (this->diagnostics).super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.data_;
      bVar2 = Diagnostic::isError(this_00);
      if (!bVar2) {
        lVar3 = sVar1 * 0x70;
        do {
          lVar3 = lVar3 + -0x70;
          this_00 = this_00 + 1;
          bVar4 = lVar3 != 0;
          if (lVar3 == 0) {
            return bVar4;
          }
          bVar2 = Diagnostic::isError(this_00);
        } while (!bVar2);
      }
    }
  }
  return bVar4;
}

Assistant:

bool LookupResult::hasError() const {
    // We have an error if we have any diagnostics or if there was a missing explicit import.
    if (!found && flags.has(LookupResultFlags::WasImported | LookupResultFlags::SuppressUndeclared))
        return true;

    for (auto& diag : diagnostics) {
        if (diag.isError())
            return true;
    }

    return false;
}